

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_CopyRectOut_Test::TestBody(Image_CopyRectOut_Test *this)

{
  int iVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  Allocator alloc;
  uint uVar5;
  Point2i p;
  int x;
  ulong uVar6;
  char *message;
  Tuple2<pbrt::Point2,_int> p_00;
  Tuple2<pbrt::Point2,_int> TVar7;
  uint nc;
  int c;
  long lVar8;
  float *pfVar9;
  Float FVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<float> buf_00;
  Bounds2i extent;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> buf;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  Image image;
  AssertHelper local_228;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  uint local_20c;
  Bounds2i local_208;
  Tuple2<pbrt::Point2,_int> local_1f8;
  PixelFormat local_1ec;
  string local_1e8;
  vector<float,_std::allocator<float>_> local_1c8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1b0;
  long local_190;
  long local_188;
  AssertHelper local_180;
  ColorEncodingHandle local_178;
  PixelFormat local_16c [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148 [2];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_16c[0] = U256;
  local_16c[1] = Half;
  local_16c[2] = 2;
  local_190 = 0;
  do {
    local_1ec = *(PixelFormat *)((long)local_16c + local_190);
    local_20c = 0;
    nc = 1;
    do {
      GetFloatPixels(&local_1b0,(Point2i)0xe0000001d,nc);
      local_148[0] = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"A","");
      __l._M_len = 1;
      __l._M_array = (iterator)local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_160,__l,(allocator_type *)&local_1e8);
      if (local_148[0] != &local_138) {
        operator_delete(local_148[0],
                        (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource + 1))
        ;
      }
      uVar5 = local_20c;
      if (1 < nc) {
        do {
          local_148[0] = &local_138;
          std::__cxx11::string::_M_construct((ulong)local_148,'\x01');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_160
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                    );
          if (local_148[0] != &local_138) {
            operator_delete(local_148[0],
                            (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource +
                                   1));
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      pbVar2 = local_160.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)local_160.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_160.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_178.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar8 >> 5;
      channels.ptr = pbVar2;
      pbrt::Image::Image((Image *)local_148,local_1ec,(Point2i)0xe0000001d,channels,&local_178,alloc
                        );
      lVar8 = 0;
      pfVar9 = local_1b0.ptr;
      do {
        local_1f8 = (Tuple2<pbrt::Point2,_int>)(lVar8 << 0x20);
        uVar6 = 0;
        local_188 = lVar8;
        do {
          p.super_Tuple2<pbrt::Point2,_int> = local_1f8 | uVar6;
          uVar5 = 0;
          do {
            pbrt::Image::SetChannel((Image *)local_148,p,uVar5,*pfVar9);
            uVar5 = uVar5 + 1;
            pfVar9 = pfVar9 + 1;
          } while (nc != uVar5);
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x1d);
        lVar8 = local_188 + 1;
      } while (lVar8 != 0xe);
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x = 5;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y = 10;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1c8,(long)(int)(nc * 0x15),(allocator_type *)&local_1e8);
      buf_00.n = (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      buf_00.ptr = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pbrt::Image::CopyRectOut((Image *)local_148,&local_208,buf_00,(WrapMode2D)0x200000002);
      iVar1 = local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      if (local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
          local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
          local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
          local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
        iVar1 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      }
      p_00 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>;
      pfVar9 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 != local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
        do {
          local_220.ptr_._0_1_ =
               pfVar9 != local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          TVar7 = p_00;
          local_1f8 = p_00;
          if (pfVar9 == local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            bVar3 = true;
          }
          else {
            uVar5 = 0;
            do {
              local_218.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_218,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              FVar10 = pbrt::Image::GetChannel
                                 ((Image *)local_148,(Point2i)p_00,uVar5,(WrapMode2D)0x200000002);
              local_220.ptr_._0_4_ = FVar10;
              testing::internal::CmpHelperEQ<float,float>
                        ((internal *)&local_1e8,"*bufIter","image.GetChannel(*pIter, c)",pfVar9,
                         (float *)&local_220);
              if ((char)local_1e8._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_220);
                message = "";
                if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
                  message = *(char **)local_1e8._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_228,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0xfa,message);
                testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_220);
                testing::internal::AssertHelper::~AssertHelper(&local_228);
                if (local_220.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar3 = testing::internal::IsTrue(true);
                  if ((bVar3) &&
                     (local_220.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_220.ptr_ + 8))();
                  }
                  local_220.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1e8._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (local_20c == uVar5) {
                pfVar9 = pfVar9 + 1;
                uVar5 = 0x16;
                bVar3 = false;
                goto LAB_002cb420;
              }
              pfVar9 = pfVar9 + 1;
              uVar5 = uVar5 + 1;
              local_220.ptr_._0_1_ =
                   pfVar9 != local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish;
            } while (pfVar9 != local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish);
            bVar3 = uVar5 < nc;
          }
          local_218.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1e8,(internal *)&local_220,(AssertionResult *)"bufIter == buf.end()",
                     "true","false",(char *)TVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xf9,(char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                            (char)local_1e8._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,(char)local_1e8._M_dataplus._M_p) !=
              &local_1e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                     (char)local_1e8._M_dataplus._M_p),
                            local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (local_228.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_228.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_228.data_ + 8))();
            }
            local_228.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_218,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar5 = 1;
LAB_002cb420:
          if (bVar3) goto LAB_002cb4ae;
          uVar5 = local_1f8.x + 1;
          TVar7 = (Tuple2<pbrt::Point2,_int>)
                  (((ulong)p_00 & 0xffffffff00000000) + 0x100000000 +
                  ((ulong)local_208.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff));
          if (uVar5 != local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
            TVar7 = (Tuple2<pbrt::Point2,_int>)((ulong)p_00 & 0xffffffff00000000 | (ulong)uVar5);
          }
          iVar1 = local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y;
          if (local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
              local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
            iVar1 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y;
          }
          p_00 = TVar7;
        } while ((local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x != TVar7.x) || (iVar1 != TVar7.y)
                );
      }
      uVar5 = 0x13;
LAB_002cb4ae:
      if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_38 = 0;
      (*(local_50.memoryResource)->_vptr_memory_resource[3])
                (local_50.memoryResource,local_48,local_40 << 2,4);
      local_58 = 0;
      (*(local_70.memoryResource)->_vptr_memory_resource[3])
                (local_70.memoryResource,local_68,local_60 * 2,2);
      local_78 = 0;
      (*(local_90.memoryResource)->_vptr_memory_resource[3])
                (local_90.memoryResource,local_88,local_80,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_160);
      local_1b0.nStored = 0;
      (*(local_1b0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1b0.alloc.memoryResource,local_1b0.ptr,local_1b0.nAlloc << 2,4);
      if (uVar5 != 0x13) {
        bVar3 = (uVar5 & 0x1b) != 0;
        goto LAB_002cb5e0;
      }
      nc = nc + 1;
      local_20c = local_20c + 1;
    } while (nc != 4);
    bVar3 = false;
LAB_002cb5e0:
    if ((bVar3) || (local_190 = local_190 + 4, local_190 == 0xc)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Image, CopyRectOut) {
    Point2i res(29, 14);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        // for (int nc : { 1, 3 }) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);

            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(2, 3), Point2i(5, 10));
            std::vector<float> buf(extent.Area() * nc);

            image.CopyRectOut(extent, pstd::MakeSpan(buf));

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    EXPECT_EQ(*bufIter, image.GetChannel(*pIter, c));
                    ++bufIter;
                }
            }
        }
    }
}